

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex00m1.cpp
# Opt level: O1

int main(void)

{
  value_type vVar1;
  value_type vVar2;
  pointer ppVar3;
  istream *this;
  ostream *poVar4;
  int iVar5;
  iterator __begin1;
  int N;
  int M;
  Comp c;
  int x;
  vector<int,_std::allocator<int>_> time;
  priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
  wait;
  int local_8c;
  int local_88;
  Comp local_81;
  pair<int,_int> local_80;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_78;
  value_type local_58;
  priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
  local_50;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105160) = 0;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_8c);
  std::istream::operator>>(this,&local_88);
  local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
  ::priority_queue(&local_50,&local_81,&local_78);
  if ((value_type)
      local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (value_type)0x0) {
    operator_delete(local_78.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (0 < local_8c) {
    iVar5 = 0;
    do {
      if (iVar5 == local_88) goto LAB_00101464;
      std::istream::operator>>((istream *)&std::cin,&local_80.first);
      local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start._4_4_ = local_80.first;
      local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = local_80.first;
      std::
      priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
      ::push(&local_50,(value_type *)&local_78);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0\n",2);
      iVar5 = iVar5 + 1;
    } while (iVar5 < local_8c);
  }
  local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vVar1 = (value_type)
          local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start;
  vVar2 = (value_type)
          local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  if (local_88 != local_8c) {
    iVar5 = 1;
    do {
      if ((local_50.c.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->first <= iVar5) {
        local_80 = *local_50.c.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        std::
        priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
        ::pop(&local_50);
        if (local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int&>
                    ((vector<int,std::allocator<int>> *)&local_78,
                     (iterator)
                     local_78.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_80.first);
        }
        else {
          (local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_finish)->first = local_80.first;
          local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               (pointer)((long)local_78.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 4);
        }
        local_58.first = local_80.first + local_80.second;
        local_58.second = local_80.second;
        std::
        priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
        ::push(&local_50,&local_58);
      }
      iVar5 = iVar5 + 1;
      vVar1 = (value_type)
              local_78.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start;
      vVar2 = (value_type)
              local_78.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish;
    } while ((ulong)((long)local_78.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_78.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 2) <
             (ulong)((long)local_88 - (long)local_8c));
  }
  for (; ppVar3 = local_78.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish,
      vVar1 != (value_type)
               local_78.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish; vVar1 = (value_type)((long)vVar1 + 4)) {
    local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)vVar2;
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*(int *)vVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    vVar2 = (value_type)
            local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish;
    local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar3;
  }
  local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)vVar2;
  if ((value_type)
      local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (value_type)0x0) {
    operator_delete(local_78.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_00101464:
  if (local_50.c.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.c.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.c.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.c.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);

    int N, M;
    cin >> N >> M;
    Comp c;
    priority_queue<pii, vector<pii>, Comp> wait(c);
    for (int i = 0; i < N; ++i) {
        if (i == M) return 0;
        int x;
        cin >> x;
        wait.push(make_pair(x, x));
        cout << "0\n";
    }
    vector<int> time;
    int i = 1;
    while (time.size() < (size_t)M-N) {
        if (wait.top().first <= i) {
            auto top = wait.top();
            wait.pop();
            time.emplace_back(top.first);
            wait.push(make_pair(top.first + top.second,
                                top.second));
        }
        ++i;
    }

    for (auto &e : time) {
        cout << e << "\n";
    }
}